

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O2

void INT_REVclear_stored(CMConnection conn,EVstone stone_num,EVaction action_num)

{
  int condition;
  CMFormat format;
  int local_34;
  EVstone local_30;
  EVaction local_2c;
  
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVclear_stored_req_formats);
  local_34 = condition;
  local_30 = stone_num;
  local_2c = action_num;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVclear_stored_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,(void *)0x0);
  INT_CMwrite(conn,format,&local_34);
  INT_CMCondition_wait(conn->cm,condition);
  return;
}

Assistant:

extern void
INT_REVclear_stored(CMConnection conn, EVstone stone_num, EVaction action_num)
{
    int cond;
    CMFormat f;
    EVclear_stored_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVclear_stored_req_formats);
    request.stone_num = stone_num;
    request.action_num = action_num;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVclear_stored_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, NULL);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
}